

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O3

void __thiscall
DListBase<Memory::CustomHeap::Page,_RealCount>::MoveElementTo
          (DListBase<Memory::CustomHeap::Page,_RealCount> *this,Page *element,
          DListBase<Memory::CustomHeap::Page,_RealCount> *list)

{
  char *pcVar1;
  DListNodeBase<Memory::CustomHeap::Page> *pDVar2;
  code *pcVar3;
  bool bVar4;
  DListNode<Memory::CustomHeap::Page> *pDVar5;
  undefined4 *puVar6;
  char **ppcVar7;
  
  ppcVar7 = &element[-1].address;
  pDVar5 = (DListNode<Memory::CustomHeap::Page> *)this;
  do {
    pDVar5 = (pDVar5->super_DListNodeBase<Memory::CustomHeap::Page>).next.node;
    if (pDVar5 == (DListNode<Memory::CustomHeap::Page> *)this) break;
  } while (pDVar5 != (DListNode<Memory::CustomHeap::Page> *)ppcVar7);
  if (pDVar5 == (DListNode<Memory::CustomHeap::Page> *)this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x1a9,"(HasNode(node))","HasNode(node)");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  pcVar1 = *ppcVar7;
  **(long **)&element[-1].currentBucket = (long)pcVar1;
  *(undefined8 *)(pcVar1 + 8) = *(undefined8 *)&element[-1].currentBucket;
  pDVar2 = (list->super_DListNodeBase<Memory::CustomHeap::Page>).next.base;
  *(anon_union_8_3_7fb8a913_for_prev *)&element[-1].currentBucket = pDVar2->prev;
  *ppcVar7 = (char *)pDVar2;
  *(char ***)pDVar2->prev = ppcVar7;
  (pDVar2->prev).base = (DListNodeBase<Memory::CustomHeap::Page> *)ppcVar7;
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  (list->super_RealCount).count = (list->super_RealCount).count + 1;
  return;
}

Assistant:

void MoveElementTo(TData * element, DListBase * list)
    {
        Node * node = CONTAINING_RECORD(element, Node, data);
#if DBG_DUMP
        Assert(HasNode(node));
#endif
        DListBase::RemoveNode(node);
        DListBase::InsertNodeBefore(list->Next(), node);
        this->DecrementCount();
        list->IncrementCount();
    }